

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O0

void pztopology::TPZPrism::ComputeHDivDirections<Fad<double>>
               (TPZFMatrix<Fad<double>_> *gradx,TPZFMatrix<Fad<double>_> *directions)

{
  int iv;
  int i_2;
  int i_1;
  TPZManVector<Fad<double>,_3> NormalScales;
  Fad<double> Nv3vdiag;
  Fad<double> Nv3v1;
  Fad<double> Nv2v3;
  Fad<double> Nv1v2;
  int i;
  TPZManVector<Fad<double>,_3> v3vdiag;
  TPZManVector<Fad<double>,_3> vdiag;
  TPZManVector<Fad<double>,_3> vec3;
  TPZManVector<Fad<double>,_3> vec2;
  TPZManVector<Fad<double>,_3> vec1;
  TPZManVector<Fad<double>,_3> v2v3;
  TPZManVector<Fad<double>,_3> v3v1;
  TPZManVector<Fad<double>,_3> v1v2;
  TPZManVector<Fad<double>,_3> v3;
  TPZManVector<Fad<double>,_3> v2;
  TPZManVector<Fad<double>,_3> v1;
  Fad<double> detjac;
  Fad<double> *in_stack_ffffffffffffebc8;
  Fad<double> *in_stack_ffffffffffffebd0;
  Fad<double> *in_stack_ffffffffffffebd8;
  TPZManVector<Fad<double>,_3> *in_stack_ffffffffffffebe0;
  Fad<double> *in_stack_ffffffffffffebe8;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffebf0;
  Fad<double> *in_stack_ffffffffffffec00;
  Fad<double> *in_stack_ffffffffffffec08;
  Fad<double> *in_stack_ffffffffffffec18;
  Fad<double> *in_stack_ffffffffffffec20;
  Fad<double> *in_stack_ffffffffffffec28;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffec58;
  int64_t in_stack_ffffffffffffec68;
  TPZManVector<Fad<double>,_3> *in_stack_ffffffffffffec70;
  int64_t in_stack_ffffffffffffec78;
  TPZManVector<Fad<double>,_3> *in_stack_ffffffffffffec80;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffed00;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffed08;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffed10;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff088;
  int local_72c;
  int local_728;
  int local_724;
  TPZVec<Fad<double>_> local_6d8 [8];
  int local_5c4;
  TPZVec<Fad<double>_> local_540 [28];
  TPZVec<Fad<double>_> local_1c0 [4];
  TPZVec<Fad<double>_> local_140 [4];
  TPZVec<Fad<double>_> local_b0 [5];
  
  TPZAxesTools<Fad<double>_>::ComputeDetjac(in_stack_fffffffffffff088);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
  for (local_5c4 = 0; local_5c4 < 3; local_5c4 = local_5c4 + 1) {
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_5c4);
    Fad<double>::operator=(in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_5c4);
    Fad<double>::operator=(in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZVec<Fad<double>_>::operator[](local_1c0,(long)local_5c4);
    Fad<double>::operator=(in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_540,(long)local_5c4);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
  }
  TPZNumeric::ProdVetorial<Fad<double>>
            (in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,in_stack_ffffffffffffed00);
  TPZNumeric::ProdVetorial<Fad<double>>
            (in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,in_stack_ffffffffffffed00);
  TPZNumeric::ProdVetorial<Fad<double>>
            (in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,in_stack_ffffffffffffed00);
  TPZNumeric::ProdVetorial<Fad<double>>
            (in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,in_stack_ffffffffffffed00);
  TPZNumeric::Norm<Fad<double>>(in_stack_ffffffffffffec58);
  TPZNumeric::Norm<Fad<double>>(in_stack_ffffffffffffec58);
  TPZNumeric::Norm<Fad<double>>(in_stack_ffffffffffffec58);
  TPZNumeric::Norm<Fad<double>>(in_stack_ffffffffffffec58);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_ffffffffffffebe0,&in_stack_ffffffffffffebd8->val_);
  TPZManVector<Fad<double>,_3>::TPZManVector
            (in_stack_ffffffffffffec80,in_stack_ffffffffffffec78,
             (Fad<double> *)in_stack_ffffffffffffec70);
  Fad<double>::~Fad(in_stack_ffffffffffffebd0);
  Fad<double>::operator=<double,_nullptr>
            ((Fad<double> *)in_stack_ffffffffffffebe0,&in_stack_ffffffffffffebd8->val_);
  Fad<double>::operator=<double,_nullptr>
            ((Fad<double> *)in_stack_ffffffffffffebe0,&in_stack_ffffffffffffebd8->val_);
  Fad<double>::operator=<double,_nullptr>
            ((Fad<double> *)in_stack_ffffffffffffebe0,&in_stack_ffffffffffffebd8->val_);
  Fad<double>::operator=<double,_nullptr>
            ((Fad<double> *)in_stack_ffffffffffffebe0,&in_stack_ffffffffffffebd8->val_);
  for (local_724 = 0; local_724 < 3; local_724 = local_724 + 1) {
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_724);
    Fad<double>::operator/=<double,_nullptr>(in_stack_ffffffffffffec20,in_stack_ffffffffffffec18);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_724);
    Fad<double>::operator/=<double,_nullptr>(in_stack_ffffffffffffec20,in_stack_ffffffffffffec18);
    TPZVec<Fad<double>_>::operator[](local_1c0,(long)local_724);
    Fad<double>::operator/=<double,_nullptr>(in_stack_ffffffffffffec20,in_stack_ffffffffffffec18);
  }
  for (local_728 = 0; local_728 < 3; local_728 = local_728 + 1) {
    for (local_72c = 0; local_72c < 7; local_72c = local_72c + 1) {
      TPZVec<Fad<double>_>::operator[](local_1c0,(long)local_728);
      Fad<double>::operator-(in_stack_ffffffffffffebd8);
      TPZVec<Fad<double>_>::operator[](local_6d8,0);
      operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffec08,
                 in_stack_ffffffffffffec00);
      operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
                 in_stack_ffffffffffffec28,(double)in_stack_ffffffffffffec20);
      TPZFMatrix<Fad<double>_>::operator()
                (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
                 (int64_t)in_stack_ffffffffffffebe0);
      Fad<double>::operator=
                ((Fad<double> *)in_stack_ffffffffffffebf0,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)in_stack_ffffffffffffebe8);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)in_stack_ffffffffffffebd0);
      FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
                 in_stack_ffffffffffffebd0);
      FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x152d9a9);
      TPZVec<Fad<double>_>::operator[](local_1c0,(long)local_728);
      TPZVec<Fad<double>_>::operator[](local_6d8,0);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
                 (double)in_stack_ffffffffffffec20);
      TPZFMatrix<Fad<double>_>::operator()
                (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
                 (int64_t)in_stack_ffffffffffffebe0);
      Fad<double>::operator=
                ((Fad<double> *)in_stack_ffffffffffffebf0,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)in_stack_ffffffffffffebe8);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebd0);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    }
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    Fad<double>::operator-(in_stack_ffffffffffffebd8);
    operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffebd0);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x152dc3b);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator*<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator*<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    Fad<double>::operator-(in_stack_ffffffffffffebd8);
    operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffebd0);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x152df5f);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    operator+<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator*<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    operator+<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    Fad<double>::operator-(in_stack_ffffffffffffebd8);
    operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffebd0);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x152e320);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    operator+<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,3);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,3);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,3);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,3);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    operator+<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,3);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    operator+<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,3);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    operator+<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    Fad<double>::operator-(in_stack_ffffffffffffebd8);
    operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffebd0);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x152ec52);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator*<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator*<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    Fad<double>::operator-(in_stack_ffffffffffffebd8);
    operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffebd0);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x152ef76);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    operator+<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator*<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    operator+<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    Fad<double>::operator-(in_stack_ffffffffffffebd8);
    operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffebd0);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x152f337);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    operator+<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    Fad<double>::operator-(in_stack_ffffffffffffebd8);
    operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffebd0);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x152f6a3);
    TPZVec<Fad<double>_>::operator[](local_1c0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,0);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_1c0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,0);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_1c0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,0);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    Fad<double>::operator-(in_stack_ffffffffffffebd8);
    operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_ffffffffffffebd0);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x152fb9b);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffec28,(double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_1c0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,0);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec28,
               (double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_1c0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,0);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffec28,(double)in_stack_ffffffffffffec20);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_1c0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,0);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    in_stack_ffffffffffffec28 = TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    in_stack_ffffffffffffec20 = TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
               (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_b0,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    in_stack_ffffffffffffec08 = TPZVec<Fad<double>_>::operator[](local_6d8,1);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    in_stack_ffffffffffffec00 =
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
                    (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    TPZVec<Fad<double>_>::operator[](local_140,(long)local_728);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    in_stack_ffffffffffffebf0 =
         (TPZFMatrix<Fad<double>_> *)TPZVec<Fad<double>_>::operator[](local_6d8,2);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    in_stack_ffffffffffffebe8 =
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
                    (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
    in_stack_ffffffffffffebe0 =
         (TPZManVector<Fad<double>,_3> *)TPZVec<Fad<double>_>::operator[](local_1c0,(long)local_728)
    ;
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00);
    in_stack_ffffffffffffebd8 = TPZVec<Fad<double>_>::operator[](local_6d8,0);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffec08,
               in_stack_ffffffffffffec00);
    in_stack_ffffffffffffebd0 =
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_ffffffffffffebf0,(int64_t)in_stack_ffffffffffffebe8,
                    (int64_t)in_stack_ffffffffffffebe0);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffebf0,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffebe8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffebd0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffebd0);
  }
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  Fad<double>::~Fad(in_stack_ffffffffffffebd0);
  Fad<double>::~Fad(in_stack_ffffffffffffebd0);
  Fad<double>::~Fad(in_stack_ffffffffffffebd0);
  Fad<double>::~Fad(in_stack_ffffffffffffebd0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffebe0);
  Fad<double>::~Fad(in_stack_ffffffffffffebd0);
  return;
}

Assistant:

void TPZPrism::ComputeHDivDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3),v1v2(3),v3v1(3),v2v3(3),vec1(3),vec2(3),vec3(3), vdiag(3), v3vdiag(3);
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
            vdiag[i] = (gradx(i,0)-gradx(i,1));
        }

        
        TPZNumeric::ProdVetorial(v1,v2,v1v2);
        TPZNumeric::ProdVetorial(v2,v3,v2v3);
        TPZNumeric::ProdVetorial(v3,v1,v3v1);
        TPZNumeric::ProdVetorial(v3,vdiag,v3vdiag);
        
        TVar Nv1v2 = TPZNumeric::Norm(v1v2);
        TVar Nv2v3 = TPZNumeric::Norm(v2v3);
        TVar Nv3v1 = TPZNumeric::Norm(v3v1);
        TVar Nv3vdiag = TPZNumeric::Norm(v3vdiag);
        
        /**
         * @file
         * @brief Computing mapped vector with scaling factor equal 1.0.
         * using contravariant piola mapping.
         */
        TPZManVector<TVar,3> NormalScales(4,1.);
        
        
        {
            Nv1v2 = 1.;
            Nv2v3 = 2.;
            Nv3v1 = 2.;
            Nv3vdiag = 2.;
        }
        
        
        for (int i=0; i<3; i++) {
            v1[i] /= detjac;
            v2[i] /= detjac;
            v3[i] /= detjac;
        }
        for (int i=0; i<3; i++)
        {
            for (int iv=0; iv<7; iv++)
            {
                directions(i,iv) = -v3[i]*NormalScales[0]*6.;
                directions(i,iv+34) = v3[i]*NormalScales[0]*6.;
            }
            //face 1
            directions(i,7) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,8) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,9) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,10) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,11) = ( directions(i,7)+directions(i,8) )/2.;
            directions(i,12) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,13) = ( directions(i,9)+directions(i,10) )/2.;
            directions(i,14) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,15) = ( directions(i,12)+directions(i,14) )/2.;
            //face 2
            directions(i,16) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,17) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,18) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,19) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,20) = (directions(i,16) + directions(i,17))/2.;
            directions(i,21) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,22) = (directions(i,18) + directions(i,19))/2.;
            directions(i,23) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,24) = (directions(i,21) + directions(i,23))/2.;
            //face 3
            directions(i,25) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,26) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,27) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,28) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,29) = ( directions(i,25)+directions(i,26) )/2.;
            directions(i,30) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,31) = ( directions(i,27)+directions(i,28) )/2.;
            directions(i,32) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,33) = ( directions(i,30)+directions(i,32) )/2.;
            
            //arestas
            directions(i,41) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,42) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,43) = -v2[i]*Nv3v1*NormalScales[2];//
            
            directions(i,44) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,45) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,46) = v3[i]*Nv1v2*NormalScales[0];
            
            directions(i,47) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,48) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,49) = -v2[i]*Nv3v1*NormalScales[2];//
            
            // internal in faces
            directions(i,50) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,51) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,52) = v1[i]*Nv2v3*NormalScales[1]/2.;//
            directions(i,53) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,54) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,55) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,56) = v2[i]*Nv3v1*NormalScales[2]/2.;
            directions(i,57) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,58) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,59) = v2[i]*Nv3v1*NormalScales[2];
            
            
            directions(i,60) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,61) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,62) = v3[i]*Nv1v2*NormalScales[0];
            
        }
        
    }